

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebp_test.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cerr,
                         "This program is just for build system testing.  Don\'t actually run it.");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  abort();
}

Assistant:

int main()
{
    std::cerr << "This program is just for build system testing.  Don't actually run it." << std::endl;
    std::abort();

    uint8_t* data;
    size_t output_size = 0;
    int width, height, stride;
    float quality;
    output_size = WebPEncodeRGB(data, width, height, stride, quality, &data);
    WebPDecodeRGBInto(data, output_size, data, output_size, stride);
    WebPFree(data);
}